

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O0

char * google::protobuf::internal::TcParser::FastSS1
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  ParseContext *pPVar1;
  MessageLite *pMVar2;
  uint64_t uVar3;
  TcParseTableBase *this;
  uchar uVar4;
  byte bVar5;
  bool bVar6;
  uint16_t uVar7;
  unsigned_short uVar8;
  uint32_t decoded_tag;
  uint uVar9;
  char *pcVar10;
  string *this_00;
  ulong uVar11;
  uint *puVar12;
  TailCallParseFunc UNRECOVERED_JUMPTABLE;
  undefined1 auVar13 [16];
  uint64_t hasbits_local;
  TcParseTableBase *table_local;
  ParseContext *ctx_local;
  char *ptr_local;
  MessageLite *msg_local;
  TcFieldData data_local;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_1a0;
  Arena *local_198;
  Arena *arena;
  ArenaStringPtr *field;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_180;
  uchar saved_tag;
  uint64_t local_178;
  TcParseTableBase *local_170;
  ParseContext *local_168;
  char *local_160;
  MessageLite *local_158;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_150;
  TcFieldData local_148;
  TcFieldData local_140;
  undefined1 local_131;
  ulong uStack_130;
  bool always_return;
  TcParseTableBase *local_128;
  ParseContext *local_120;
  char *local_118;
  MessageLite *local_110;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_108;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_100;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_f8;
  TcFieldData data_1;
  FastFieldEntry *fast_entry;
  size_t idx;
  unsigned_short coded_tag;
  uint32_t has_bits_offset;
  
  local_178 = hasbits;
  local_170 = table;
  local_168 = ctx;
  local_160 = ptr;
  local_158 = msg;
  local_150 = data.field_0;
  uVar4 = TcFieldData::coded_tag<unsigned_char>((TcFieldData *)&local_150);
  pMVar2 = local_158;
  pcVar10 = local_160;
  pPVar1 = local_168;
  if (uVar4 != '\0') {
    TcFieldData::TcFieldData((TcFieldData *)&stack0xfffffffffffffe80);
    pcVar10 = MiniParse(pMVar2,pcVar10,pPVar1,(TcFieldData)aStack_180,local_170,local_178);
    return pcVar10;
  }
  field._7_1_ = UnalignedLoad<unsigned_char>(local_160);
  local_160 = local_160 + 1;
  bVar5 = TcFieldData::hasbit_idx((TcFieldData *)&local_150);
  pMVar2 = local_158;
  local_178 = 1L << (bVar5 & 0x3f) | local_178;
  uVar7 = TcFieldData::offset((TcFieldData *)&local_150);
  arena = (Arena *)RefAt<google::protobuf::internal::ArenaStringPtr>(pMVar2,(ulong)uVar7);
  local_198 = MessageLite::GetArena(local_158);
  pMVar2 = local_158;
  pcVar10 = local_160;
  pPVar1 = local_168;
  if (local_198 == (Arena *)0x0) {
    bVar5 = TcFieldData::aux_idx((TcFieldData *)&local_150);
    local_160 = anon_unknown_130::ReadStringNoArena
                          (pMVar2,pcVar10,pPVar1,(uint)bVar5,local_170,(ArenaStringPtr *)arena);
  }
  else {
    TcFieldData::aux_idx((TcFieldData *)&local_150);
    local_160 = EpsCopyInputStream::ReadArenaString
                          (&pPVar1->super_EpsCopyInputStream,pcVar10,(ArenaStringPtr *)arena,
                           local_198);
  }
  pMVar2 = local_158;
  pPVar1 = local_168;
  if (local_160 != (char *)0x0) {
    this_00 = ArenaStringPtr::Get_abi_cxx11_((ArenaStringPtr *)arena);
    auVar13 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_00);
    uVar11 = utf8_range::IsStructurallyValid(auVar13._0_8_,auVar13._8_8_);
    if ((uVar11 & 1) == 0) {
      decoded_tag = FastDecodeTag(field._7_1_);
      ReportFastUtf8Error(decoded_tag,local_170);
    }
    pMVar2 = local_158;
    pcVar10 = local_160;
    pPVar1 = local_168;
    TcFieldData::TcFieldData(&data_local);
    local_108 = data_local.field_0;
    local_110 = pMVar2;
    local_118 = pcVar10;
    local_120 = pPVar1;
    local_128 = local_170;
    uStack_130 = local_178;
    local_131 = 0;
    bVar6 = EpsCopyInputStream::DataAvailable(&pPVar1->super_EpsCopyInputStream,pcVar10);
    pMVar2 = local_110;
    pcVar10 = local_118;
    pPVar1 = local_120;
    if (bVar6) {
      TcFieldData::TcFieldData(&local_148);
      this = local_128;
      uVar3 = uStack_130;
      uVar8 = UnalignedLoad<unsigned_short>(pcVar10);
      uVar11 = (ulong)(int)((uint)uVar8 & (uint)this->fast_idx_mask);
      if ((uVar11 & 7) == 0) {
        data_1.field_0 =
             (anon_union_8_1_898a9ca8_for_TcFieldData_0)
             TcParseTableBase::fast_entry(this,uVar11 >> 3);
        local_f8.data =
             ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)((long)data_1.field_0 + 8))->data ^
             (ulong)uVar8;
        UNRECOVERED_JUMPTABLE =
             TcParseTableBase::FastFieldEntry::target((FastFieldEntry *)data_1.field_0);
        local_100.data = local_f8.data;
        pcVar10 = (*UNRECOVERED_JUMPTABLE)(pMVar2,pcVar10,pPVar1,(TcFieldData)local_f8,this,uVar3);
        return pcVar10;
      }
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x44d);
    }
    TcFieldData::TcFieldData(&local_140);
    if (local_128->has_bits_offset != 0) {
      uVar9 = (uint)uStack_130;
      puVar12 = RefAt<unsigned_int>(pMVar2,(ulong)(uint)local_128->has_bits_offset);
      *puVar12 = uVar9 | *puVar12;
    }
    return pcVar10;
  }
  TcFieldData::TcFieldData((TcFieldData *)&local_1a0);
  pcVar10 = Error(pMVar2,(char *)0x0,pPVar1,(TcFieldData)local_1a0,local_170,local_178);
  return pcVar10;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastSS1(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return SingularString<uint8_t, ArenaStringPtr,
                                          kUtf8ValidateOnly>(
      PROTOBUF_TC_PARAM_PASS);
}